

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra_shortest_paths.hpp
# Opt level: O2

void boost::detail::
     dijkstra_dispatch1<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::param_not_found,boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,boost::bgl_named_params<boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>>
               (long g,undefined8 s,undefined4 param_3,undefined8 param_4)

{
  vector<double,_std::allocator<double>_> distance_map;
  allocator_type local_41;
  _Vector_base<double,_std::allocator<double>_> local_40;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_40,
             *(long *)(g + 0x20) - *(long *)(g + 0x18) >> 5,&local_41);
  dijkstra_dispatch2<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::iterator_property_map<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,double,double&>,boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,boost::bgl_named_params<boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>>
            (g,s,local_40._M_impl.super__Vector_impl_data._M_start,param_3,param_4);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

inline void
    dijkstra_dispatch1
      (const VertexListGraph& g,
       typename graph_traits<VertexListGraph>::vertex_descriptor s,
       DistanceMap distance, WeightMap weight, IndexMap index_map,
       const Params& params)
    {
      // Default for distance map
      typedef typename property_traits<WeightMap>::value_type D;
      typename std::vector<D>::size_type
        n = is_default_param(distance) ? num_vertices(g) : 1;
      std::vector<D> distance_map(n);

      detail::dijkstra_dispatch2
        (g, s, choose_param(distance, make_iterator_property_map
                            (distance_map.begin(), index_map,
                             distance_map[0])),
         weight, index_map, params);
    }